

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O2

void kf_work(kiss_fft_cpx *Fout,kiss_fft_cpx *f,size_t fstride,int in_stride,int *factors,
            kiss_fft_cfg st)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  kiss_fft_cpx kVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  kiss_fft_cpx *pkVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  kiss_fft_cpx *pkVar18;
  kiss_fft_cpx *pkVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  int iVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  int local_58;
  
  uVar6 = factors[1];
  lVar15 = (long)(int)uVar6;
  uVar7 = *factors;
  if (lVar15 == 1) {
    lVar16 = 0;
    do {
      kVar9 = *f;
      f = f + (long)in_stride * fstride;
      *(kiss_fft_cpx *)((long)&Fout->r + lVar16) = kVar9;
      lVar16 = lVar16 + 8;
    } while ((long)(int)(uVar6 * uVar7) * 8 != lVar16);
  }
  else {
    lVar16 = 0;
    do {
      kf_work((kiss_fft_cpx *)((long)&Fout->r + lVar16),f,(long)(int)uVar7 * fstride,in_stride,
              factors + 2,st);
      lVar16 = lVar16 + lVar15 * 8;
      f = f + (long)in_stride * fstride;
    } while ((long)(int)(uVar6 * uVar7) * 8 != lVar16);
  }
  auVar37 = _DAT_0017e4e0;
  switch(uVar7) {
  case 2:
    pkVar18 = st->twiddles;
    lVar16 = 0;
    do {
      auVar50._8_8_ = 0;
      auVar50._0_4_ = pkVar18->r;
      auVar50._4_4_ = pkVar18->i;
      pkVar18 = pkVar18 + fstride;
      auVar45._0_4_ = -Fout[lVar15 + lVar16].i;
      auVar45._4_4_ = 0x80000000;
      auVar45._8_4_ = 0x80000000;
      auVar45._12_4_ = 0x80000000;
      auVar38 = vpermt2ps_avx512vl(ZEXT416((uint)Fout[lVar15 + lVar16].i),auVar37,auVar45);
      auVar39 = vshufps_avx(auVar50,auVar50,0xe1);
      auVar41._0_4_ = auVar39._0_4_ * auVar38._0_4_;
      auVar41._4_4_ = auVar39._4_4_ * auVar38._4_4_;
      auVar41._8_4_ = auVar39._8_4_ * auVar38._8_4_;
      auVar41._12_4_ = auVar39._12_4_ * auVar38._12_4_;
      fVar40 = Fout[lVar15 + lVar16].r;
      auVar12._4_4_ = fVar40;
      auVar12._0_4_ = fVar40;
      auVar12._8_4_ = fVar40;
      auVar12._12_4_ = fVar40;
      auVar38 = vfmadd231ps_avx512vl(auVar41,auVar50,auVar12);
      auVar46._8_8_ = 0;
      auVar46._0_4_ = Fout[lVar16].r;
      auVar46._4_4_ = Fout[lVar16].i;
      auVar39 = vsubps_avx(auVar46,auVar38);
      kVar9 = (kiss_fft_cpx)vmovlps_avx(auVar39);
      Fout[lVar15 + lVar16] = kVar9;
      auVar42._0_4_ = auVar38._0_4_ + Fout[lVar16].r;
      auVar42._4_4_ = auVar38._4_4_ + Fout[lVar16].i;
      auVar42._8_4_ = auVar38._8_4_ + 0.0;
      auVar42._12_4_ = auVar38._12_4_ + 0.0;
      kVar9 = (kiss_fft_cpx)vmovlps_avx(auVar42);
      Fout[lVar16] = kVar9;
      lVar16 = lVar16 + 1;
    } while (uVar6 != (uint)lVar16);
    break;
  case 3:
    auVar48._8_4_ = 0xbf000000;
    auVar48._0_8_ = 0xbf000000bf000000;
    auVar48._12_4_ = 0xbf000000;
    lVar17 = 0;
    fVar40 = st->twiddles[lVar15 * fstride].i;
    lVar16 = lVar15;
    do {
      auVar71._8_8_ = 0;
      auVar71._0_8_ = *(ulong *)((long)&st->twiddles[0].r + lVar17);
      auVar57._0_4_ = -Fout[lVar15].i;
      auVar57._4_4_ = 0x80000000;
      auVar57._8_4_ = 0x80000000;
      auVar57._12_4_ = 0x80000000;
      auVar67._0_4_ = -Fout[lVar15 * 2].i;
      auVar67._4_4_ = 0x80000000;
      auVar67._8_4_ = 0x80000000;
      auVar67._12_4_ = 0x80000000;
      auVar38 = vpermt2ps_avx512vl(ZEXT416((uint)Fout[lVar15].i),auVar37,auVar57);
      auVar39 = vshufps_avx(auVar71,auVar71,0xe1);
      auVar31 = vpermt2ps_avx512vl(ZEXT416((uint)Fout[lVar15 * 2].i),auVar37,auVar67);
      auVar54._0_4_ = auVar39._0_4_ * auVar38._0_4_;
      auVar54._4_4_ = auVar39._4_4_ * auVar38._4_4_;
      auVar54._8_4_ = auVar39._8_4_ * auVar38._8_4_;
      auVar54._12_4_ = auVar39._12_4_ * auVar38._12_4_;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = *(ulong *)((long)&st->twiddles[0].r + lVar17 * 2);
      fVar44 = Fout[lVar15].r;
      auVar10._4_4_ = fVar44;
      auVar10._0_4_ = fVar44;
      auVar10._8_4_ = fVar44;
      auVar10._12_4_ = fVar44;
      auVar38 = vfmadd231ps_avx512vl(auVar54,auVar71,auVar10);
      lVar17 = lVar17 + fstride * 8;
      auVar39 = vshufps_avx(auVar58,auVar58,0xe1);
      auVar64._0_4_ = auVar39._0_4_ * auVar31._0_4_;
      auVar64._4_4_ = auVar39._4_4_ * auVar31._4_4_;
      auVar64._8_4_ = auVar39._8_4_ * auVar31._8_4_;
      auVar64._12_4_ = auVar39._12_4_ * auVar31._12_4_;
      fVar44 = Fout[lVar15 * 2].r;
      auVar11._4_4_ = fVar44;
      auVar11._0_4_ = fVar44;
      auVar11._8_4_ = fVar44;
      auVar11._12_4_ = fVar44;
      auVar39 = vfmadd231ps_avx512vl(auVar64,auVar58,auVar11);
      auVar68._8_8_ = 0;
      auVar68._0_4_ = Fout->r;
      auVar68._4_4_ = Fout->i;
      auVar59._0_4_ = auVar38._0_4_ + auVar39._0_4_;
      auVar59._4_4_ = auVar38._4_4_ + auVar39._4_4_;
      auVar59._8_4_ = auVar38._8_4_ + auVar39._8_4_;
      auVar59._12_4_ = auVar38._12_4_ + auVar39._12_4_;
      auVar38 = vsubps_avx(auVar38,auVar39);
      auVar31 = vfmadd231ps_fma(auVar68,auVar59,auVar48);
      auVar39 = vmovshdup_avx(auVar38);
      fVar44 = fVar40 * auVar38._0_4_;
      fVar61 = fVar40 * auVar39._0_4_;
      kVar9 = (kiss_fft_cpx)vmovlps_avx(auVar31);
      Fout[lVar15] = kVar9;
      auVar60._0_4_ = auVar59._0_4_ + (*Fout).r;
      auVar60._4_4_ = auVar59._4_4_ + (*Fout).i;
      auVar60._8_4_ = auVar59._8_4_ + 0.0;
      auVar60._12_4_ = auVar59._12_4_ + 0.0;
      kVar9 = (kiss_fft_cpx)vmovlps_avx(auVar60);
      *Fout = kVar9;
      Fout[lVar15 * 2].r = fVar61 + Fout[lVar15].r;
      Fout[lVar15 * 2].i = Fout[lVar15].i - fVar44;
      Fout[lVar15].r = Fout[lVar15].r - fVar61;
      Fout[lVar15].i = fVar44 + Fout[lVar15].i;
      Fout = Fout + 1;
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
    break;
  case 4:
    iVar8 = st->inverse;
    pkVar13 = st->twiddles;
    lVar16 = 0;
    lVar17 = 0;
    pkVar18 = pkVar13;
    do {
      auVar69._8_8_ = 0;
      auVar69._0_8_ = *(ulong *)((long)&pkVar13->r + lVar17);
      auVar36._0_4_ = -Fout[lVar15 + lVar16].i;
      auVar36._4_4_ = 0x80000000;
      auVar36._8_4_ = 0x80000000;
      auVar36._12_4_ = 0x80000000;
      auVar66._0_4_ = -Fout[lVar15 * 3 + lVar16].i;
      auVar66._4_4_ = 0x80000000;
      auVar66._8_4_ = 0x80000000;
      auVar66._12_4_ = 0x80000000;
      auVar55._0_4_ = -Fout[lVar15 * 2 + lVar16].i;
      auVar55._4_4_ = 0x80000000;
      auVar55._8_4_ = 0x80000000;
      auVar55._12_4_ = 0x80000000;
      auVar38 = vpermt2ps_avx512vl(ZEXT416((uint)Fout[lVar15 + lVar16].i),auVar37,auVar36);
      auVar39 = vshufps_avx(auVar69,auVar69,0xe1);
      auVar31 = vpermt2ps_avx512vl(ZEXT416((uint)Fout[lVar15 * 3 + lVar16].i),auVar37,auVar66);
      auVar34 = vpermt2ps_avx512vl(ZEXT416((uint)Fout[lVar15 * 2 + lVar16].i),auVar37,auVar55);
      auVar35._0_4_ = auVar39._0_4_ * auVar38._0_4_;
      auVar35._4_4_ = auVar39._4_4_ * auVar38._4_4_;
      auVar35._8_4_ = auVar39._8_4_ * auVar38._8_4_;
      auVar35._12_4_ = auVar39._12_4_ * auVar38._12_4_;
      auVar47._8_8_ = 0;
      auVar47._0_4_ = pkVar18->r;
      auVar47._4_4_ = pkVar18->i;
      fVar40 = Fout[lVar15 + lVar16].r;
      auVar29._4_4_ = fVar40;
      auVar29._0_4_ = fVar40;
      auVar29._8_4_ = fVar40;
      auVar29._12_4_ = fVar40;
      auVar38 = vfmadd231ps_avx512vl(auVar35,auVar69,auVar29);
      auVar39 = vshufps_avx(auVar47,auVar47,0xe1);
      auVar62._0_4_ = auVar39._0_4_ * auVar31._0_4_;
      auVar62._4_4_ = auVar39._4_4_ * auVar31._4_4_;
      auVar62._8_4_ = auVar39._8_4_ * auVar31._8_4_;
      auVar62._12_4_ = auVar39._12_4_ * auVar31._12_4_;
      fVar40 = Fout[lVar15 * 3 + lVar16].r;
      auVar32._4_4_ = fVar40;
      auVar32._0_4_ = fVar40;
      auVar32._8_4_ = fVar40;
      auVar32._12_4_ = fVar40;
      auVar39 = vfmadd231ps_avx512vl(auVar62,auVar47,auVar32);
      auVar70._0_4_ = auVar38._0_4_ + auVar39._0_4_;
      auVar70._4_4_ = auVar38._4_4_ + auVar39._4_4_;
      auVar70._8_4_ = auVar38._8_4_ + auVar39._8_4_;
      auVar70._12_4_ = auVar38._12_4_ + auVar39._12_4_;
      auVar31 = vsubps_avx(auVar38,auVar39);
      auVar63._8_8_ = 0;
      auVar63._0_8_ = *(ulong *)((long)&pkVar13->r + lVar17 * 2);
      auVar39 = vmovshdup_avx(auVar31);
      auVar38 = vshufps_avx(auVar63,auVar63,0xe1);
      auVar51._0_4_ = auVar38._0_4_ * auVar34._0_4_;
      auVar51._4_4_ = auVar38._4_4_ * auVar34._4_4_;
      auVar51._8_4_ = auVar38._8_4_ * auVar34._8_4_;
      auVar51._12_4_ = auVar38._12_4_ * auVar34._12_4_;
      fVar40 = Fout[lVar15 * 2 + lVar16].r;
      auVar33._4_4_ = fVar40;
      auVar33._0_4_ = fVar40;
      auVar33._8_4_ = fVar40;
      auVar33._12_4_ = fVar40;
      auVar38 = vfmadd231ps_avx512vl(auVar51,auVar63,auVar33);
      kVar9 = Fout[lVar16];
      auVar56._8_8_ = 0;
      auVar56._0_4_ = kVar9.r;
      auVar56._4_4_ = kVar9.i;
      auVar34 = vsubps_avx(auVar56,auVar38);
      auVar52._0_4_ = auVar38._0_4_ + kVar9.r;
      auVar52._4_4_ = auVar38._4_4_ + kVar9.i;
      auVar52._8_4_ = auVar38._8_4_ + 0.0;
      auVar52._12_4_ = auVar38._12_4_ + 0.0;
      Fout[lVar16].r = auVar52._0_4_;
      fVar40 = (float)vextractps_avx(auVar52,1);
      Fout[lVar16].i = fVar40;
      auVar30 = vsubps_avx(auVar52,auVar70);
      auVar38 = vmovshdup_avx(auVar34);
      kVar9 = (kiss_fft_cpx)vmovlps_avx(auVar30);
      Fout[lVar15 * 2 + lVar16] = kVar9;
      auVar53._0_4_ = auVar70._0_4_ + Fout[lVar16].r;
      auVar53._4_4_ = auVar70._4_4_ + Fout[lVar16].i;
      auVar53._8_4_ = auVar70._8_4_ + 0.0;
      auVar53._12_4_ = auVar70._12_4_ + 0.0;
      kVar9 = (kiss_fft_cpx)vmovlps_avx(auVar53);
      Fout[lVar16] = kVar9;
      fVar61 = auVar34._0_4_;
      fVar40 = auVar31._0_4_;
      fVar44 = auVar39._0_4_;
      fVar65 = auVar38._0_4_;
      if (iVar8 == 0) {
        fVar2 = fVar61 + fVar44;
        fVar72 = fVar65 - fVar40;
        fVar49 = fVar61 - fVar44;
        fVar3 = fVar65 + fVar40;
      }
      else {
        fVar49 = fVar61 + fVar44;
        fVar3 = fVar65 - fVar40;
        fVar2 = fVar61 - fVar44;
        fVar72 = fVar65 + fVar40;
      }
      Fout[lVar15 + lVar16].r = fVar2;
      Fout[lVar15 + lVar16].i = fVar72;
      Fout[lVar15 * 3 + lVar16].r = fVar49;
      Fout[lVar15 * 3 + lVar16].i = fVar3;
      pkVar18 = pkVar18 + fstride * 3;
      lVar17 = lVar17 + fstride * 8;
      lVar16 = lVar16 + 1;
    } while (lVar15 != lVar16);
    break;
  case 5:
    lVar21 = 0;
    lVar22 = 0;
    lVar16 = lVar15 * fstride;
    fVar40 = st->twiddles[lVar16].r;
    fVar44 = st->twiddles[lVar16].i;
    fVar61 = st->twiddles[lVar16 * 2].r;
    fVar65 = st->twiddles[lVar16 * 2].i;
    lVar20 = (long)(int)(uVar6 * 2);
    lVar17 = (long)(int)(uVar6 * 3);
    lVar16 = (long)(int)(uVar6 * 4);
    for (lVar25 = 0; lVar15 != lVar25; lVar25 = lVar25 + 1) {
      fVar49 = *(float *)((long)&st->twiddles[0].i + lVar22);
      fVar72 = *(float *)((long)&st->twiddles[0].r + lVar22);
      fVar2 = *(float *)((long)&st->twiddles[0].i + lVar22 * 2);
      fVar3 = st->twiddles[lVar21].i;
      pfVar1 = &st->twiddles[0].i + lVar22;
      fVar4 = Fout[lVar25].r;
      fVar5 = Fout[lVar25].i;
      auVar34 = vfmsub231ss_fma(ZEXT416((uint)(fVar49 * Fout[lVar15 + lVar25].i)),
                                ZEXT416((uint)Fout[lVar15 + lVar25].r),ZEXT416((uint)fVar72));
      auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar72 * Fout[lVar15 + lVar25].i)),
                                ZEXT416((uint)Fout[lVar15 + lVar25].r),ZEXT416((uint)fVar49));
      fVar49 = *(float *)((long)&st->twiddles[0].r + lVar22 * 2);
      auVar31 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * Fout[lVar20 + lVar25].i)),
                                ZEXT416((uint)Fout[lVar20 + lVar25].r),ZEXT416((uint)fVar49));
      auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar49 * Fout[lVar20 + lVar25].i)),
                                ZEXT416((uint)Fout[lVar20 + lVar25].r),ZEXT416((uint)fVar2));
      fVar49 = st->twiddles[lVar21].r;
      lVar21 = lVar21 + fstride * 3;
      auVar30 = vfmsub231ss_fma(ZEXT416((uint)(fVar3 * Fout[lVar17 + lVar25].i)),
                                ZEXT416((uint)Fout[lVar17 + lVar25].r),ZEXT416((uint)fVar49));
      auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar49 * Fout[lVar17 + lVar25].i)),
                                ZEXT416((uint)Fout[lVar17 + lVar25].r),ZEXT416((uint)fVar3));
      fVar49 = (&st->twiddles[0].r)[lVar22];
      lVar22 = lVar22 + fstride * 8;
      auVar29 = vaddss_avx512f(auVar31,auVar30);
      fVar2 = auVar31._0_4_ - auVar30._0_4_;
      auVar30 = vmulss_avx512f(ZEXT416((uint)fVar65),ZEXT416((uint)fVar2));
      auVar33 = ZEXT416((uint)*pfVar1);
      auVar31 = vmulss_avx512f(auVar33,ZEXT416((uint)Fout[lVar16 + lVar25].i));
      auVar32 = vfmsub231ss_avx512f(auVar31,ZEXT416((uint)Fout[lVar16 + lVar25].r),
                                    ZEXT416((uint)fVar49));
      auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar49 * Fout[lVar16 + lVar25].i)),
                                ZEXT416((uint)Fout[lVar16 + lVar25].r),auVar33);
      fVar49 = auVar37._0_4_ + auVar38._0_4_;
      fVar3 = auVar37._0_4_ - auVar38._0_4_;
      auVar33 = vaddss_avx512f(auVar34,auVar32);
      fVar72 = auVar31._0_4_ + auVar39._0_4_;
      auVar32 = vsubss_avx512f(auVar34,auVar32);
      auVar38 = vmulss_avx512f(ZEXT416((uint)fVar65),ZEXT416((uint)fVar3));
      auVar34 = vaddss_avx512f(auVar29,auVar33);
      auVar37 = vfmadd213ss_fma(ZEXT416((uint)fVar40),ZEXT416((uint)fVar72),ZEXT416((uint)fVar5));
      auVar31 = ZEXT416((uint)(auVar39._0_4_ - auVar31._0_4_));
      auVar35 = vfmadd231ss_avx512f(auVar38,auVar31,ZEXT416((uint)fVar44));
      auVar38 = vfnmsub231ss_avx512f(auVar30,auVar32,ZEXT416((uint)fVar44));
      auVar39 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar49),ZEXT416((uint)fVar61));
      Fout[lVar25].r = auVar34._0_4_ + fVar4;
      auVar37 = vfmadd213ss_fma(ZEXT416((uint)fVar72),ZEXT416((uint)fVar61),ZEXT416((uint)fVar5));
      auVar30 = vsubss_avx512f(auVar39,auVar38);
      auVar36 = vaddss_avx512f(auVar39,auVar38);
      auVar38 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar40),ZEXT416((uint)fVar49));
      Fout[lVar25].i = fVar49 + fVar72 + fVar5;
      auVar37 = vfmadd213ss_fma(ZEXT416((uint)fVar40),auVar33,ZEXT416((uint)fVar4));
      auVar39 = vfmadd213ss_fma(auVar33,ZEXT416((uint)fVar61),ZEXT416((uint)fVar4));
      auVar34 = vfnmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar44)),ZEXT416((uint)fVar65),auVar31);
      auVar31 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar44)),ZEXT416((uint)fVar65),auVar32);
      auVar37 = vfmadd231ss_avx512f(auVar37,auVar29,ZEXT416((uint)fVar61));
      auVar39 = vfmadd231ss_avx512f(auVar39,ZEXT416((uint)fVar40),auVar29);
      auVar29 = vsubss_avx512f(auVar37,auVar35);
      auVar37 = vaddss_avx512f(auVar35,auVar37);
      Fout[lVar15 + lVar25].r = auVar29._0_4_;
      Fout[lVar15 + lVar25].i = auVar30._0_4_;
      Fout[lVar16 + lVar25].r = auVar37._0_4_;
      Fout[lVar16 + lVar25].i = auVar36._0_4_;
      Fout[lVar20 + lVar25].r = auVar34._0_4_ + auVar39._0_4_;
      Fout[lVar20 + lVar25].i = auVar38._0_4_ + auVar31._0_4_;
      Fout[lVar17 + lVar25].r = auVar39._0_4_ - auVar34._0_4_;
      Fout[lVar17 + lVar25].i = auVar38._0_4_ - auVar31._0_4_;
    }
    break;
  default:
    iVar8 = st->nfft;
    pkVar13 = (kiss_fft_cpx *)malloc((long)(int)uVar7 << 3);
    auVar37 = _DAT_0017e4e0;
    uVar14 = ~((int)uVar7 >> 0x1f) & uVar7;
    pkVar18 = Fout;
    for (uVar27 = 0; uVar27 != (~((int)uVar6 >> 0x1f) & uVar6); uVar27 = uVar27 + 1) {
      pkVar19 = pkVar18;
      for (uVar23 = 0; uVar14 != uVar23; uVar23 = uVar23 + 1) {
        kVar9 = *pkVar19;
        pkVar19 = pkVar19 + lVar15;
        pkVar13[uVar23] = kVar9;
      }
      uVar23 = uVar27;
      for (uVar26 = 0; uVar26 != uVar14; uVar26 = uVar26 + 1) {
        local_58 = (int)fstride;
        iVar24 = 0;
        auVar43 = ZEXT864((ulong)*pkVar13);
        Fout[uVar23] = *pkVar13;
        lVar16 = 0;
        while ((ulong)uVar7 - 1 != lVar16) {
          iVar24 = iVar24 + (int)uVar23 * local_58;
          iVar28 = iVar8;
          if (iVar24 < iVar8) {
            iVar28 = 0;
          }
          iVar24 = iVar24 - iVar28;
          auVar30._8_8_ = 0;
          auVar30._0_4_ = st->twiddles[iVar24].r;
          auVar30._4_4_ = st->twiddles[iVar24].i;
          auVar34._0_4_ = -pkVar13[lVar16 + 1].i;
          auVar34._4_4_ = 0x80000000;
          auVar34._8_4_ = 0x80000000;
          auVar34._12_4_ = 0x80000000;
          auVar38 = vpermt2ps_avx512vl(ZEXT416((uint)pkVar13[lVar16 + 1].i),auVar37,auVar34);
          auVar39 = vshufps_avx(auVar30,auVar30,0xe1);
          auVar31._0_4_ = auVar39._0_4_ * auVar38._0_4_;
          auVar31._4_4_ = auVar39._4_4_ * auVar38._4_4_;
          auVar31._8_4_ = auVar39._8_4_ * auVar38._8_4_;
          auVar31._12_4_ = auVar39._12_4_ * auVar38._12_4_;
          fVar40 = pkVar13[lVar16 + 1].r;
          auVar39._4_4_ = fVar40;
          auVar39._0_4_ = fVar40;
          auVar39._8_4_ = fVar40;
          auVar39._12_4_ = fVar40;
          auVar39 = vfmadd231ps_avx512vl(auVar31,auVar30,auVar39);
          lVar16 = lVar16 + 1;
          auVar38._0_4_ = auVar43._0_4_ + auVar39._0_4_;
          auVar38._4_4_ = auVar43._4_4_ + auVar39._4_4_;
          auVar38._8_4_ = auVar43._8_4_ + auVar39._8_4_;
          auVar38._12_4_ = auVar43._12_4_ + auVar39._12_4_;
          auVar43 = ZEXT1664(auVar38);
          kVar9 = (kiss_fft_cpx)vmovlps_avx(auVar38);
          Fout[uVar23] = kVar9;
        }
        uVar23 = uVar23 + lVar15;
      }
      pkVar18 = pkVar18 + 1;
    }
    free(pkVar13);
    return;
  }
  return;
}

Assistant:

static
void kf_work(
        kiss_fft_cpx * Fout,
        const kiss_fft_cpx * f,
        const size_t fstride,
        int in_stride,
        int * factors,
        const kiss_fft_cfg st
        )
{
    kiss_fft_cpx * Fout_beg=Fout;
    const int p=*factors++; /* the radix  */
    const int m=*factors++; /* stage's fft length/p */
    const kiss_fft_cpx * Fout_end = Fout + p*m;

#ifdef _OPENMP
    /*
    use openmp extensions at the 
    top-level (not recursive)
    */
    if (fstride==1 && p<=5)
    {
        int k;

        /* execute the p different work units in different threads */
#       pragma omp parallel for
        for (k=0;k<p;++k) 
            kf_work( Fout +k*m, f+ fstride*in_stride*k,fstride*p,in_stride,factors,st);
        /* all threads have joined by this point */

        switch (p) {
            case 2: kf_bfly2(Fout,fstride,st,m); break;
            case 3: kf_bfly3(Fout,fstride,st,m); break; 
            case 4: kf_bfly4(Fout,fstride,st,m); break;
            case 5: kf_bfly5(Fout,fstride,st,m); break; 
            default: kf_bfly_generic(Fout,fstride,st,m,p); break;
        }
        return;
    }
#endif

    if (m==1) {
        do{
            *Fout = *f;
            f += fstride*in_stride;
        }while(++Fout != Fout_end );
    }else{
        do{
            /*
            recursive call:
            DFT of size m*p performed by doing
            p instances of smaller DFTs of size m, 
            each one takes a decimated version of the input
            */
            kf_work( Fout , f, fstride*p, in_stride, factors,st);
            f += fstride*in_stride;
        }while( (Fout += m) != Fout_end );
    }

    Fout=Fout_beg;

    /* recombine the p smaller DFTs */
    switch (p) {
        case 2: kf_bfly2(Fout,fstride,st,m); break;
        case 3: kf_bfly3(Fout,fstride,st,m); break; 
        case 4: kf_bfly4(Fout,fstride,st,m); break;
        case 5: kf_bfly5(Fout,fstride,st,m); break; 
        default: kf_bfly_generic(Fout,fstride,st,m,p); break;
    }
}